

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnownFormats.h
# Opt level: O0

Item * __thiscall jbcoin::KnownFormats<int>::add(KnownFormats<int> *this,char *name,int type)

{
  Item *pIVar1;
  Item *pIVar2;
  reference this_00;
  mapped_type *ppIVar3;
  string *__k;
  mapped_type *ppIVar4;
  int local_44;
  Item *local_40;
  Item *item;
  unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>
  local_28;
  int local_1c;
  char *pcStack_18;
  int type_local;
  char *name_local;
  KnownFormats<int> *this_local;
  
  local_1c = type;
  pcStack_18 = name;
  name_local = (char *)this;
  std::make_unique<jbcoin::KnownFormats<int>::Item,char_const*&,int&>
            ((char **)&local_28,(int *)&stack0xffffffffffffffe8);
  std::
  vector<std::unique_ptr<jbcoin::KnownFormats<int>::Item,std::default_delete<jbcoin::KnownFormats<int>::Item>>,std::allocator<std::unique_ptr<jbcoin::KnownFormats<int>::Item,std::default_delete<jbcoin::KnownFormats<int>::Item>>>>
  ::
  emplace_back<std::unique_ptr<jbcoin::KnownFormats<int>::Item,std::default_delete<jbcoin::KnownFormats<int>::Item>>>
            ((vector<std::unique_ptr<jbcoin::KnownFormats<int>::Item,std::default_delete<jbcoin::KnownFormats<int>::Item>>,std::allocator<std::unique_ptr<jbcoin::KnownFormats<int>::Item,std::default_delete<jbcoin::KnownFormats<int>::Item>>>>
              *)&this->m_formats,&local_28);
  std::
  unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>
  ::~unique_ptr(&local_28);
  this_00 = std::
            vector<std::unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>,_std::allocator<std::unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>_>_>
            ::back(&this->m_formats);
  local_40 = std::
             unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>
             ::operator*(this_00);
  (**this->_vptr_KnownFormats)(this,local_40);
  pIVar1 = local_40;
  local_44 = Item::getType(local_40);
  ppIVar3 = std::
            map<int,_jbcoin::KnownFormats<int>::Item_*,_std::less<int>,_std::allocator<std::pair<const_int,_jbcoin::KnownFormats<int>::Item_*>_>_>
            ::operator[](&this->m_types,&local_44);
  pIVar2 = local_40;
  *ppIVar3 = pIVar1;
  __k = Item::getName_abi_cxx11_(local_40);
  ppIVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<int>::Item_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<int>::Item_*>_>_>
            ::operator[](&this->m_names,__k);
  *ppIVar4 = pIVar2;
  return local_40;
}

Assistant:

Item& add (char const* name, KeyType type)
    {
        m_formats.emplace_back (
            std::make_unique <Item> (name, type));
        auto& item (*m_formats.back());

        addCommonFields (item);

        m_types [item.getType ()] = &item;
        m_names [item.getName ()] = &item;

        return item;
    }